

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O0

void __thiscall ExpressionContext::PushScope(ExpressionContext *this,TypeBase *type)

{
  uint uniqueId;
  ScopeData *this_00;
  ScopeData *local_20;
  ScopeData *next;
  TypeBase *type_local;
  ExpressionContext *this_local;
  
  next = (ScopeData *)type;
  type_local = (TypeBase *)this;
  this_00 = get<ScopeData>(this);
  uniqueId = this->uniqueScopeId;
  this->uniqueScopeId = uniqueId + 1;
  ScopeData::ScopeData(this_00,this->allocator,this->scope,uniqueId,(TypeBase *)next);
  local_20 = this_00;
  if (this->scope != (ScopeData *)0x0) {
    SmallArray<ScopeData_*,_2U>::push_back(&this->scope->scopes,&local_20);
  }
  this->scope = local_20;
  if (this->lookupLocation != (SynBase *)0x0) {
    this->scope->unrestricted = true;
  }
  return;
}

Assistant:

void ExpressionContext::PushScope(TypeBase *type)
{
	ScopeData *next = new (get<ScopeData>()) ScopeData(allocator, scope, uniqueScopeId++, type);

	if(scope)
		scope->scopes.push_back(next);

	scope = next;

	if(lookupLocation)
		scope->unrestricted = true;
}